

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,true>
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> begin,
               __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> end,
               int param_3,ulong param_4)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  double __tmp_9;
  double __tmp;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
  pVar18;
  _Iter_comp_iter<std::less<double>_> __cmp;
  _Iter_comp_iter<std::less<double>_> __cmp_1;
  _Iter_comp_iter<std::less<double>_> local_32;
  _Iter_comp_iter<std::less<double>_> local_31;
  
  param_4 = param_4 & 0xffffffff;
  do {
    uVar11 = (long)end._M_current - (long)begin._M_current >> 3;
    if ((long)uVar11 < 0x18) {
      pdVar10 = begin._M_current + 1;
      if ((param_4 & 1) == 0) {
        _Var8._M_current = begin._M_current;
        if (pdVar10 != end._M_current && begin._M_current != end._M_current) {
          do {
            dVar2 = _Var8._M_current[1];
            pdVar14 = pdVar10;
            if (dVar2 < *_Var8._M_current) {
              do {
                pdVar15 = pdVar14 + -2;
                *pdVar14 = pdVar14[-1];
                pdVar14 = pdVar14 + -1;
              } while (dVar2 < *pdVar15);
              *pdVar14 = dVar2;
            }
            pdVar14 = pdVar10 + 1;
            _Var8._M_current = pdVar10;
            pdVar10 = pdVar14;
          } while (pdVar14 != end._M_current);
        }
      }
      else if (pdVar10 != end._M_current && begin._M_current != end._M_current) {
        lVar5 = 8;
        _Var8._M_current = begin._M_current;
        do {
          pdVar14 = pdVar10;
          dVar2 = _Var8._M_current[1];
          lVar9 = lVar5;
          if (dVar2 < *_Var8._M_current) {
            do {
              *(undefined8 *)((long)begin._M_current + lVar9) =
                   *(undefined8 *)((long)begin._M_current + lVar9 + -8);
              _Var8._M_current = begin._M_current;
              if (lVar9 == 8) goto LAB_0028e169;
              lVar17 = lVar9 + -0x10;
              lVar9 = lVar9 + -8;
            } while (dVar2 < *(begin._M_current + lVar17));
            _Var8._M_current = lVar9 + begin._M_current;
LAB_0028e169:
            *_Var8._M_current = dVar2;
          }
          pdVar10 = pdVar14 + 1;
          lVar5 = lVar5 + 8;
          _Var8._M_current = pdVar14;
        } while (pdVar10 != end._M_current);
      }
LAB_0028e726:
      bVar4 = true;
      _Var8._M_current = begin._M_current;
    }
    else {
      uVar6 = uVar11 >> 1;
      if ((long)uVar11 < 0x81) {
        dVar2 = begin._M_current[uVar6];
        if (*begin._M_current < dVar2) {
          begin._M_current[uVar6] = *begin._M_current;
          *begin._M_current = dVar2;
        }
        dVar2 = *begin._M_current;
        if (end._M_current[-1] < dVar2) {
          *begin._M_current = end._M_current[-1];
          end._M_current[-1] = dVar2;
        }
        dVar2 = begin._M_current[uVar6];
        if (*begin._M_current < dVar2) {
          begin._M_current[uVar6] = *begin._M_current;
          *begin._M_current = dVar2;
        }
      }
      else {
        dVar2 = *begin._M_current;
        if (begin._M_current[uVar6] < dVar2) {
          *begin._M_current = begin._M_current[uVar6];
          begin._M_current[uVar6] = dVar2;
        }
        dVar2 = begin._M_current[uVar6];
        if (end._M_current[-1] < dVar2) {
          begin._M_current[uVar6] = end._M_current[-1];
          end._M_current[-1] = dVar2;
        }
        dVar2 = *begin._M_current;
        if (begin._M_current[uVar6] < dVar2) {
          *begin._M_current = begin._M_current[uVar6];
          begin._M_current[uVar6] = dVar2;
        }
        dVar2 = begin._M_current[1];
        if (begin._M_current[uVar6 - 1] < dVar2) {
          begin._M_current[1] = begin._M_current[uVar6 - 1];
          begin._M_current[uVar6 - 1] = dVar2;
        }
        dVar2 = begin._M_current[uVar6 - 1];
        if (end._M_current[-2] < dVar2) {
          begin._M_current[uVar6 - 1] = end._M_current[-2];
          end._M_current[-2] = dVar2;
        }
        dVar2 = begin._M_current[1];
        if (begin._M_current[uVar6 - 1] < dVar2) {
          begin._M_current[1] = begin._M_current[uVar6 - 1];
          begin._M_current[uVar6 - 1] = dVar2;
        }
        dVar2 = begin._M_current[2];
        if (begin._M_current[uVar6 + 1] < dVar2) {
          begin._M_current[2] = begin._M_current[uVar6 + 1];
          begin._M_current[uVar6 + 1] = dVar2;
        }
        dVar2 = begin._M_current[uVar6 + 1];
        if (end._M_current[-3] < dVar2) {
          begin._M_current[uVar6 + 1] = end._M_current[-3];
          end._M_current[-3] = dVar2;
        }
        dVar2 = begin._M_current[2];
        if (begin._M_current[uVar6 + 1] < dVar2) {
          begin._M_current[2] = begin._M_current[uVar6 + 1];
          begin._M_current[uVar6 + 1] = dVar2;
        }
        dVar2 = begin._M_current[uVar6 - 1];
        if (begin._M_current[uVar6] < dVar2) {
          begin._M_current[uVar6 - 1] = begin._M_current[uVar6];
          begin._M_current[uVar6] = dVar2;
        }
        dVar2 = begin._M_current[uVar6];
        if (begin._M_current[uVar6 + 1] < dVar2) {
          begin._M_current[uVar6] = begin._M_current[uVar6 + 1];
          begin._M_current[uVar6 + 1] = dVar2;
        }
        dVar2 = begin._M_current[uVar6 - 1];
        if (begin._M_current[uVar6] < dVar2) {
          begin._M_current[uVar6 - 1] = begin._M_current[uVar6];
          begin._M_current[uVar6] = dVar2;
        }
        dVar2 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar6];
        begin._M_current[uVar6] = dVar2;
      }
      if (((param_4 & 1) != 0) ||
         (dVar2 = *begin._M_current, begin._M_current[-1] <= dVar2 && dVar2 != begin._M_current[-1])
         ) {
        pVar18 = partition_right_branchless<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
                           (begin._M_current,end._M_current);
        _Var7 = pVar18.first._M_current;
        uVar12 = (long)_Var7._M_current - (long)begin._M_current >> 3;
        _Var8._M_current = _Var7._M_current + 1;
        uVar6 = (long)end._M_current - (long)_Var8._M_current >> 3;
        if (((long)uVar12 < (long)(uVar11 >> 3)) || ((long)uVar6 < (long)(uVar11 >> 3))) {
          param_3 = param_3 + -1;
          if (param_3 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<double>>>
                      (begin,end,&local_32);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<double>>>
                      (begin,end,&local_31);
            param_3 = 0;
            goto LAB_0028e726;
          }
          if (0x17 < (long)uVar12) {
            uVar11 = uVar12 >> 2;
            dVar2 = *begin._M_current;
            *begin._M_current = begin._M_current[uVar11];
            begin._M_current[uVar11] = dVar2;
            dVar2 = _Var7._M_current[-1];
            _Var7._M_current[-1] = _Var7._M_current[-uVar11];
            _Var7._M_current[-uVar11] = dVar2;
            if (0x80 < (long)uVar12) {
              dVar2 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar11 + 1];
              begin._M_current[uVar11 + 1] = dVar2;
              dVar2 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar11 + 2];
              begin._M_current[uVar11 + 2] = dVar2;
              dVar2 = _Var7._M_current[-2];
              _Var7._M_current[-2] = _Var7._M_current[~uVar11];
              _Var7._M_current[~uVar11] = dVar2;
              dVar2 = _Var7._M_current[-3];
              _Var7._M_current[-3] = _Var7._M_current[-2 - uVar11];
              _Var7._M_current[-2 - uVar11] = dVar2;
            }
          }
          if (0x17 < (long)uVar6) {
            uVar11 = uVar6 >> 2;
            dVar2 = _Var7._M_current[1];
            _Var7._M_current[1] = _Var7._M_current[uVar11 + 1];
            _Var7._M_current[uVar11 + 1] = dVar2;
            dVar2 = end._M_current[-1];
            end._M_current[-1] = end._M_current[-uVar11];
            end._M_current[-uVar11] = dVar2;
            if (0x80 < (long)uVar6) {
              dVar2 = _Var7._M_current[2];
              _Var7._M_current[2] = _Var7._M_current[uVar11 + 2];
              _Var7._M_current[uVar11 + 2] = dVar2;
              dVar2 = _Var7._M_current[3];
              _Var7._M_current[3] = _Var7._M_current[uVar11 + 3];
              _Var7._M_current[uVar11 + 3] = dVar2;
              dVar2 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar11];
              end._M_current[~uVar11] = dVar2;
              dVar2 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar11];
              end._M_current[-2 - uVar11] = dVar2;
            }
          }
        }
        else if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (begin._M_current == _Var7._M_current) {
LAB_0028e65b:
            if (_Var8._M_current == end._M_current) goto LAB_0028e726;
            pdVar10 = _Var7._M_current + 2;
            lVar5 = 8;
            lVar9 = 0;
            uVar11 = 0;
            do {
              pdVar14 = _Var7._M_current + lVar5 + 8;
              if (pdVar14 == end._M_current) goto LAB_0028e726;
              dVar2 = *(_Var7._M_current + lVar5 + 8);
              pdVar15 = pdVar10;
              lVar17 = lVar9;
              if (dVar2 < *(_Var7._M_current + lVar5)) {
                do {
                  *pdVar15 = pdVar15[-1];
                  pdVar16 = _Var8._M_current;
                  if (lVar17 == 0) break;
                  pdVar1 = pdVar15 + -2;
                  pdVar16 = pdVar15 + -1;
                  pdVar15 = pdVar16;
                  lVar17 = lVar17 + 8;
                } while (dVar2 < *pdVar1);
                *pdVar16 = dVar2;
                uVar11 = uVar11 + ((long)pdVar14 - (long)pdVar16 >> 3);
              }
              lVar5 = lVar5 + 8;
              pdVar10 = pdVar10 + 1;
              lVar9 = lVar9 + -8;
            } while (uVar11 < 9);
          }
          else {
            lVar5 = 8;
            uVar11 = 0;
            _Var13._M_current = begin._M_current;
            do {
              pdVar10 = _Var13._M_current + 1;
              if (pdVar10 == _Var7._M_current) goto LAB_0028e65b;
              dVar2 = _Var13._M_current[1];
              lVar9 = lVar5;
              if (dVar2 < *_Var13._M_current) {
                do {
                  *(undefined8 *)((long)begin._M_current + lVar9) =
                       *(undefined8 *)((long)begin._M_current + lVar9 + -8);
                  _Var13._M_current = begin._M_current;
                  if (lVar9 == 8) goto LAB_0028e478;
                  lVar17 = lVar9 + -0x10;
                  lVar9 = lVar9 + -8;
                } while (dVar2 < *(begin._M_current + lVar17));
                _Var13._M_current = lVar9 + begin._M_current;
LAB_0028e478:
                *_Var13._M_current = dVar2;
                uVar11 = uVar11 + ((long)pdVar10 - (long)_Var13._M_current >> 3);
              }
              lVar5 = lVar5 + 8;
              _Var13._M_current = pdVar10;
            } while (uVar11 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,true>
                  (begin._M_current,_Var7._M_current,param_3);
        bVar4 = false;
        param_4 = 0;
      }
      else {
        lVar5 = 0;
        do {
          lVar9 = lVar5 + -8;
          lVar5 = lVar5 + -8;
        } while (dVar2 < *(end._M_current + lVar9));
        pdVar10 = end._M_current + lVar5;
        _Var8._M_current = begin._M_current;
        if (lVar5 == -8) {
          do {
            if (pdVar10 <= _Var8._M_current) break;
            pdVar14 = _Var8._M_current + 1;
            _Var8._M_current = _Var8._M_current + 1;
          } while (*pdVar14 <= dVar2);
        }
        else {
          do {
            pdVar14 = _Var8._M_current + 1;
            _Var8._M_current = _Var8._M_current + 1;
          } while (*pdVar14 <= dVar2);
        }
        while (_Var8._M_current < pdVar10) {
          dVar3 = *_Var8._M_current;
          *_Var8._M_current = *pdVar10;
          *pdVar10 = dVar3;
          do {
            pdVar14 = pdVar10 + -1;
            pdVar10 = pdVar10 + -1;
          } while (dVar2 < *pdVar14);
          do {
            pdVar14 = _Var8._M_current + 1;
            _Var8._M_current = _Var8._M_current + 1;
          } while (*pdVar14 <= dVar2);
        }
        *begin._M_current = *pdVar10;
        *pdVar10 = dVar2;
        _Var8._M_current = pdVar10 + 1;
        bVar4 = false;
      }
    }
    begin._M_current = _Var8._M_current;
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }